

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
visit(wasm::Expression*,wasm::IString_(void *this,Expression *curr,IString nextResult)

{
  char **ppcVar1;
  byte bVar2;
  _Rb_tree_color _Var3;
  Id IVar4;
  iterator __position;
  pointer pSVar5;
  uint *puVar6;
  uintptr_t uVar7;
  ValueBuilder *pVVar8;
  _Base_ptr p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Name name;
  Name name_00;
  Module *pMVar12;
  size_t sVar13;
  size_t sVar14;
  ValueBuilder *this_00;
  size_t sVar15;
  int iVar16;
  Index IVar17;
  JsType JVar18;
  uint uVar19;
  Value *pVVar20;
  double *pdVar21;
  mapped_type *pmVar22;
  undefined8 extraout_RAX;
  Value *this_01;
  Function *pFVar23;
  Ref RVar24;
  Ref RVar25;
  Ref RVar26;
  size_type sVar27;
  const_iterator cVar28;
  _Rb_tree_node_base *p_Var29;
  Ref *pRVar30;
  ArrayStorage *pAVar31;
  NameScope scope;
  pointer pSVar32;
  uint *puVar33;
  long lVar34;
  ulong extraout_RDX_01;
  _Base_ptr p_Var35;
  ulong extraout_RDX_02;
  char *extraout_RDX_03;
  long lVar37;
  undefined8 *puVar38;
  ValueBuilder *this_02;
  JsSign JVar39;
  undefined1 *puVar40;
  Expression *pEVar41;
  Wasm2JSBuilder *this_03;
  wasm2js *pwVar42;
  Module *pMVar43;
  IString *this_04;
  Type type;
  Ref in_R8;
  Ref in_R9;
  _Base_ptr p_Var44;
  pointer ppEVar45;
  ulong uVar46;
  key_type pSVar47;
  pointer ppEVar48;
  size_t sVar49;
  bool bVar50;
  IString target;
  IString op;
  Name name_01;
  IString name_02;
  IString target_00;
  IString target_01;
  IString target_02;
  IString target_03;
  IString label;
  IString name_03;
  Name name_04;
  IString target_04;
  IString target_05;
  IString op_00;
  IString target_06;
  IString op_01;
  IString op_02;
  IString target_07;
  IString target_08;
  IString target_09;
  IString target_10;
  IString op_03;
  IString target_11;
  string_view sVar51;
  HeapAndPointer HVar52;
  IString IVar53;
  Expression EVar54;
  IString nextResult_00;
  IString nextResult_01;
  IString nextResult_02;
  IString nextResult_03;
  IString key;
  IString nextResult_04;
  IString specific;
  IString nextResult_05;
  IString nextResult_06;
  IString nextResult_07;
  IString nextResult_08;
  IString key_00;
  IString nextResult_09;
  IString nextResult_10;
  IString nextResult_11;
  IString nextResult_12;
  IString nextResult_13;
  IString nextResult_14;
  IString nextResult_15;
  IString nextResult_16;
  IString specific_00;
  IString nextResult_17;
  IString nextResult_18;
  IString nextResult_19;
  IString nextResult_20;
  IString specific_01;
  IString specific_02;
  IString nextResult_21;
  IString nextResult_22;
  IString key_01;
  IString nextResult_23;
  IString nextResult_24;
  IString op_04;
  IString op_05;
  IString key_02;
  IString nextResult_25;
  IString nextResult_26;
  IString nextResult_27;
  IString nextResult_28;
  IString nextResult_29;
  IString op_06;
  IString specific_03;
  IString specific_04;
  IString nextResult_30;
  IString nextResult_31;
  IString op_07;
  IString nextResult_32;
  IString nextResult_33;
  IString nextResult_34;
  IString specific_05;
  IString specific_06;
  IString nextResult_35;
  IString nextResult_36;
  IString nextResult_37;
  IString op_08;
  IString op_09;
  IString op_10;
  Name name_05;
  Ref args_3;
  IString old;
  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  targetIndexes;
  Name local_b8;
  undefined1 local_a8 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> emittedTargets;
  key_type local_70;
  ulong local_68;
  pointer local_60;
  SwitchCase *case_;
  char *pcStack_50;
  Ref local_48;
  char *pcStack_40;
  long *local_38;
  char *extraout_RDX;
  char *extraout_RDX_00;
  size_t sVar36;
  
  IVar53.str._M_str = nextResult.str._M_str;
  specific_05.str._M_str = (char *)nextResult.str._M_len;
  args_3.inst = *(Value **)((long)this + 8);
  old.str._M_len = *(size_t *)((long)this + 0x10);
  *(char **)((long)this + 8) = specific_05.str._M_str;
  *(char **)((long)this + 0x10) = IVar53.str._M_str;
  sVar15 = DAT_00da8c60;
  this_00 = cashew::B_NOT;
  sVar49 = DAT_00da8c50;
  this_02 = cashew::L_NOT;
  sVar14 = DAT_00da8c10;
  pVVar8 = cashew::MINUS;
  sVar13 = DAT_00da8770;
  pMVar12 = WASM_MEMORY_GROW;
  sVar36 = DAT_00da8670;
  pMVar43 = MATH_CLZ32;
  if (curr == (Expression *)0x0) {
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                  ,0x3a,
                  "ReturnType wasm::Visitor<ExpressionProcessor, cashew::Ref>::visit(Expression *) [SubType = ExpressionProcessor, ReturnType = cashew::Ref]"
                 );
  }
  case_ = (SwitchCase *)curr;
  local_38 = (long *)this;
  switch(curr->_id) {
  case BlockId:
    lVar37 = *(long *)((long)this + 0x188);
    if (lVar37 != 0) {
      lVar34 = (long)this + 0x180;
      do {
        bVar50 = *(Expression **)(lVar37 + 0x20) < curr;
        if (!bVar50) {
          lVar34 = lVar37;
        }
        lVar37 = *(long *)(lVar37 + 0x10 + (ulong)bVar50 * 8);
      } while (lVar37 != 0);
      if ((lVar34 != (long)this + 0x180) && (*(Expression **)(lVar34 + 0x20) <= curr)) {
        if (curr[2].type.id == 0) goto LAB_005c3bf6;
        pEVar41 = (Expression *)**(undefined8 **)(curr + 2);
        IVar53.str._M_str = DAT_00da8840;
        specific_05.str._M_str = NO_RESULT;
        goto LAB_005c2777;
      }
    }
    RVar24 = cashew::ValueBuilder::makeBlock();
    uVar7 = curr[2].type.id;
    if (uVar7 != 0) {
      uVar46 = 0;
      do {
        if (curr[2].type.id <= uVar46) goto LAB_005c3bf6;
        nextResult_11.str._M_str = DAT_00da8840;
        nextResult_11.str._M_len = (size_t)NO_RESULT;
        RVar25 = IString_(local_38,*(Expression **)(*(long *)(curr + 2) + uVar46 * 8),nextResult_11)
        ;
        flattenAppend(RVar24,RVar25);
        uVar46 = uVar46 + 1;
      } while (uVar7 != uVar46);
    }
    this = local_38;
    IVar53.str._M_str = (char *)curr[1].type.id;
    if (IVar53.str._M_str != (char *)0x0) {
      RVar25.inst = (Value *)0x3;
      name_01.super_IString.str._M_str = IVar53.str._M_str;
      name_01.super_IString.str._M_len = *(size_t *)(curr + 1);
      IVar53 = fromName((Wasm2JSBuilder *)*local_38,name_01,Label);
      name_02.str._M_str = (char *)RVar24.inst;
      name_02.str._M_len = (size_t)IVar53.str._M_str;
      RVar24 = cashew::ValueBuilder::makeLabel((ValueBuilder *)IVar53.str._M_len,name_02,RVar25);
    }
    break;
  case IfId:
    nextResult_12.str._M_str = (char *)DAT_00da8850;
    nextResult_12.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(this,*(Expression **)(curr + 1),nextResult_12);
    nextResult_13.str._M_str = DAT_00da8840;
    nextResult_13.str._M_len = (size_t)NO_RESULT;
    RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_13);
    if (*(Expression **)(curr + 2) == (Expression *)0x0) {
      RVar26.inst = (Value *)0x0;
    }
    else {
      nextResult_14.str._M_str = DAT_00da8840;
      nextResult_14.str._M_len = (size_t)NO_RESULT;
      RVar26 = IString_(this,*(Expression **)(curr + 2),nextResult_14);
    }
    RVar24 = cashew::ValueBuilder::makeIf(RVar24,RVar25,RVar26);
    this = this;
    break;
  case LoopId:
    old.str._M_str._0_4_ = curr[1]._id;
    old.str._M_str._4_4_ = *(undefined4 *)&curr[1].field_0x4;
    targetIndexes._M_t._M_impl._0_4_ = *(undefined4 *)&curr[1].type.id;
    targetIndexes._M_t._M_impl._4_4_ = *(undefined4 *)((long)&curr[1].type.id + 4);
    local_a8 = (undefined1  [8])((long)this + 0x1d8);
    std::
    _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
              ();
    RVar24.inst = *(Value **)(curr + 2);
    RVar25 = IString_(this,RVar24.inst,(IString)*(string_view *)((long)this + 8));
    if (*(long *)(*(long *)(curr + 2) + 8) == 0) {
      RVar25 = blockify(cashew::Ref_(RVar25.inst,RVar24);
      name.super_IString.str._M_len._4_4_ = old.str._M_str._4_4_;
      name.super_IString.str._M_len._0_4_ = (Id)old.str._M_str;
      name.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
      name.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
      IVar53 = fromName(*this,name,Label);
      label.str._M_str = IVar53.str._M_str;
      label.str._M_len = (size_t)label.str._M_str;
      RVar24 = cashew::ValueBuilder::makeBreak((ValueBuilder *)IVar53.str._M_len,label);
      flattenAppend(RVar25,RVar24);
    }
    else if (*(long *)(*(long *)(curr + 2) + 8) != 1) {
      __assert_fail("curr->body->type == Type::none",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                    ,0x4c0,
                    "Ref wasm::Wasm2JSBuilder::processFunctionBody(Module *, Function *, bool)::ExpressionProcessor::visitLoop(Loop *)"
                   );
    }
    puVar40 = &DAT_00000018;
    RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar24.inst)->type = Null;
    cashew::Value::free(RVar24.inst,puVar40);
    (RVar24.inst)->type = Number;
    ((RVar24.inst)->field_1).str.str._M_len = 0x3ff0000000000000;
    RVar24 = cashew::ValueBuilder::makeWhile(RVar24,RVar25);
    name_00.super_IString.str._M_len._4_4_ = old.str._M_str._4_4_;
    name_00.super_IString.str._M_len._0_4_ = (Id)old.str._M_str;
    name_00.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
    name_00.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
    RVar25.inst = (Value *)0x3;
    IVar53 = fromName(*this,name_00,Label);
    name_03.str._M_str = (char *)RVar24.inst;
    name_03.str._M_len = (size_t)IVar53.str._M_str;
    RVar24 = cashew::ValueBuilder::makeLabel((ValueBuilder *)IVar53.str._M_len,name_03,RVar25);
    this = this;
    break;
  case BreakId:
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = curr[2].type.id;
    if (emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
      RVar24 = makeBreakOrContinue(wasm::Name_(this,(Name)curr[1]);
      this = this;
      break;
    }
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(curr + 2);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&old.str._M_str;
    uVar7 = (curr->type).id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = curr[1]._id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
         *(undefined4 *)&curr[1].field_0x4;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)curr[1].type.id;
    old.str._M_str._0_4_ = (Id)*(undefined8 *)curr;
    old.str._M_str._4_4_ = (undefined4)((ulong)*(undefined8 *)curr >> 0x20);
    targetIndexes._M_t._M_impl._0_4_ = SUB84(uVar7,0);
    targetIndexes._M_t._M_impl._4_4_ = SUB84(uVar7 >> 0x20,0);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pEVar41 = (Expression *)local_a8;
    local_a8._0_4_ = 2;
    emittedTargets._M_t._M_impl._0_8_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    goto LAB_005c2777;
  case SwitchId:
    nextResult_05.str._M_str = (char *)DAT_00da8850;
    nextResult_05.str._M_len = EXPRESSION_RESULT;
    local_70 = (key_type)curr;
    RVar24 = IString_(this,(Expression *)curr[4].type.id,nextResult_05);
    RVar24 = makeJsCoercion(RVar24,JS_INT);
    local_48 = cashew::ValueBuilder::makeSwitch(RVar24);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&targetIndexes
    ;
    targetIndexes._M_t._M_impl._0_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (curr[1].type.id != 0) {
      lVar37 = 0;
      ppEVar45 = (pointer)0x0;
      do {
        pmVar22 = std::
                  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&old.str._M_str,
                               (key_type *)
                               ((long)(((SwitchCase *)curr)->code).
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar37));
        local_a8._0_4_ = (uint)ppEVar45;
        __position._M_current =
             (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (pmVar22,__position,(uint *)local_a8);
        }
        else {
          *__position._M_current = (uint)ppEVar45;
          (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        ppEVar45 = (pointer)((long)ppEVar45 + 1);
        lVar37 = lVar37 + 0x10;
        curr = (Expression *)case_;
      } while (ppEVar45 <
               (case_->code).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    this = local_38;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
                 ::operator[]((map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
                               *)(local_38 + 0x35),&local_70);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&emittedTargets;
    emittedTargets._M_t._M_impl._0_8_ = (ulong)(uint)emittedTargets._M_t._M_impl._4_4_ << 0x20;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pSVar32 = (((mapped_type *)emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->
              super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (((mapped_type *)emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->
             super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (pSVar32 == pSVar5) {
      local_68 = 0;
    }
    else {
      local_68 = 0;
      do {
        local_b8.super_IString.str._M_len = (pSVar32->target).super_IString.str._M_len;
        local_b8.super_IString.str._M_str = (pSVar32->target).super_IString.str._M_str;
        local_60 = pSVar32;
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)local_a8,&local_b8);
        if ((pointer)local_b8.super_IString.str._M_str ==
            case_[1].code.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          cashew::ValueBuilder::appendDefaultToSwitch(local_48);
        }
        else {
          pmVar22 = std::
                    map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                  *)&old.str._M_str,&local_b8);
          puVar6 = (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar33 = (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start; puVar33 != puVar6;
              puVar33 = puVar33 + 1) {
            uVar19 = *puVar33;
            puVar40 = &DAT_00000018;
            RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
            (RVar24.inst)->type = Null;
            cashew::Value::free(RVar24.inst,puVar40);
            (RVar24.inst)->type = Number;
            ((RVar24.inst)->field_1).num = (double)uVar19;
            cashew::ValueBuilder::appendCaseToSwitch(local_48,RVar24);
          }
        }
        this = local_38;
        ppEVar45 = (local_60->code).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar48 = (local_60->code).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (ppEVar45 != ppEVar48) {
          do {
            pVVar20 = (Value *)*ppEVar45;
            nextResult_06.str._M_str = DAT_00da8840;
            nextResult_06.str._M_len = (size_t)NO_RESULT;
            RVar24.inst = pVVar20;
            RVar25 = IString_(this,(Expression *)pVVar20,nextResult_06);
            RVar24 = blockify(cashew::Ref_(RVar25.inst,RVar24);
            cashew::ValueBuilder::appendCodeToSwitch(local_48,RVar24,false);
            ppEVar45 = ppEVar45 + 1;
          } while (ppEVar45 != ppEVar48);
          local_68 = CONCAT71((int7)((ulong)extraout_RAX >> 8),
                              (pVVar20->field_1).str.str._M_len == 1);
        }
        pSVar32 = local_60 + 1;
      } while (pSVar32 != pSVar5);
    }
    pSVar32 = (pointer)0x0;
    p_Var29 = targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pSVar47 = (key_type)case_;
    if (targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&targetIndexes) {
      do {
        case_ = (SwitchCase *)(p_Var29 + 1);
        cVar28 = std::
                 _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)local_a8,(key_type *)case_);
        if (cVar28._M_node == (_Base_ptr)&emittedTargets) {
          if ((((ulong)pSVar32 & 1) == 0) &&
             (*(long *)emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              *(long *)(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) &&
              (local_68 & 1) == 0)) {
            RVar25.inst = (Value *)0x0;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = extraout_RDX_01;
            RVar24 = cashew::ValueBuilder::makeBreak((ValueBuilder *)0x0,(IString)(auVar10 << 0x40))
            ;
            RVar24 = blockify(cashew::Ref_(RVar24.inst,RVar25);
            pSVar32 = (pointer)CONCAT71((int7)((ulong)pSVar32 >> 8),1);
            cashew::ValueBuilder::appendCodeToSwitch(local_48,RVar24,false);
          }
          p_Var35 = p_Var29[1]._M_parent;
          if (p_Var35 != (_Base_ptr)(local_70->default_).super_IString.str._M_str) {
            p_Var44 = p_Var29[1]._M_left;
            p_Var9 = p_Var29[1]._M_right;
            local_60 = pSVar32;
            if (p_Var44 != p_Var9) {
              do {
                _Var3 = p_Var44->_M_color;
                puVar40 = &DAT_00000018;
                RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
                (RVar24.inst)->type = Null;
                cashew::Value::free(RVar24.inst,puVar40);
                (RVar24.inst)->type = Number;
                ((RVar24.inst)->field_1).num = (double)_Var3;
                cashew::ValueBuilder::appendCaseToSwitch(local_48,RVar24);
                p_Var44 = (_Base_ptr)&p_Var44->field_0x4;
              } while (p_Var44 != p_Var9);
              p_Var35 = p_Var29[1]._M_parent;
            }
            this = local_38;
            RVar24.inst = (Value *)(case_->target).super_IString.str._M_len;
            name_04.super_IString.str._M_str = (char *)p_Var35;
            name_04.super_IString.str._M_len = (size_t)RVar24.inst;
            RVar25 = makeBreakOrContinue(wasm::Name_(local_38,name_04);
            pSVar32 = local_60;
            RVar24 = blockify(cashew::Ref_(RVar25.inst,RVar24);
            cashew::ValueBuilder::appendCodeToSwitch(local_48,RVar24,false);
          }
        }
        p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29);
        pSVar47 = local_70;
      } while (p_Var29 != (_Rb_tree_node_base *)&targetIndexes);
    }
    cVar28 = std::
             _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)local_a8,&pSVar47->default_);
    RVar24.inst = local_48.inst;
    if (cVar28._M_node == (_Base_ptr)&emittedTargets) {
      if ((((ulong)pSVar32 & 1) == 0) &&
         (*(long *)emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          *(long *)(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) &&
          (local_68 & 1) == 0)) {
        RVar26.inst = (Value *)0x0;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = extraout_RDX_02;
        RVar25 = cashew::ValueBuilder::makeBreak((ValueBuilder *)0x0,(IString)(auVar11 << 0x40));
        RVar25 = blockify(cashew::Ref_(RVar25.inst,RVar26);
        cashew::ValueBuilder::appendCodeToSwitch(RVar24,RVar25,false);
      }
      cashew::ValueBuilder::appendDefaultToSwitch(RVar24);
      RVar25.inst = (Value *)(pSVar47->default_).super_IString.str._M_len;
      RVar26 = makeBreakOrContinue(wasm::Name_(this,(Name)(pSVar47->default_).super_IString.str);
      RVar25 = blockify(cashew::Ref_(RVar26.inst,RVar25);
      cashew::ValueBuilder::appendCodeToSwitch(RVar24,RVar25,false);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_a8);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)&old.str._M_str);
    break;
  case CallId:
    if ((char)curr[4]._id == BlockId) {
      ppcVar1 = &old.str._M_str;
      Fatal::Fatal((Fatal *)ppcVar1);
      Fatal::operator<<((Fatal *)ppcVar1,(char (*) [40])"tail calls not yet supported in wasm2js");
      goto LAB_005c3e7a;
    }
    IVar53 = fromName(*this,(Name)curr[3],Top);
    target_00.str._M_str = IVar53.str._M_str;
    target_00.str._M_len = (size_t)target_00.str._M_str;
    RVar24 = cashew::ValueBuilder::makeCall((ValueBuilder *)IVar53.str._M_len,target_00);
    old.str._M_str._0_4_ = (Id)RVar24.inst;
    old.str._M_str._4_4_ = (undefined4)((ulong)RVar24.inst >> 0x20);
    local_48.inst._0_1_ = 1;
    if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
      pFVar23 = Module::getFunction(*(Module **)((long)this + 0x20),(Name)curr[3]);
      local_48.inst._0_1_ =
           (pFVar23->super_Importable).module.super_IString.str._M_str != (char *)0x0;
    }
    ppEVar45 = (pointer)curr[1].type.id;
    if (ppEVar45 != (pointer)0x0) {
      ppEVar48 = (pointer)0x0;
      do {
        if ((((SwitchCase *)curr)->code).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish <= ppEVar48) goto LAB_005c3bf6;
        pEVar41 = (((SwitchCase *)curr)->code).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[(long)ppEVar48];
        nextResult_21.str._M_str = (char *)DAT_00da8850;
        nextResult_21.str._M_len = EXPRESSION_RESULT;
        RVar24 = IString_(local_38,pEVar41,nextResult_21);
        if ((char)local_48.inst != '\0') {
          JVar18 = wasmToJsType((Type)(pEVar41->type).id);
          RVar24 = makeJsCoercion(RVar24,JVar18);
        }
        pRVar30 = cashew::Ref::operator[]((Ref *)&old.str._M_str,2);
        cashew::Value::push_back(pRVar30->inst,RVar24);
        ppEVar48 = (pointer)((long)ppEVar48 + 1);
        curr = (Expression *)case_;
      } while (ppEVar45 != ppEVar48);
      RVar24.inst = (Value *)CONCAT44(old.str._M_str._4_4_,(Id)old.str._M_str);
      this = local_38;
    }
    if ((char)local_48.inst == '\0') break;
    type.id = ((Type *)&(((SwitchCase *)curr)->target).super_IString.str._M_str)->id;
    goto LAB_005c32ce;
  case CallIndirectId:
    RVar24 = visitCallIndirect(wasm::CallIndirect__(this,(CallIndirect *)curr);
    this = this;
    break;
  case LocalGetId:
    sVar51 = (string_view)
             Function::getLocalNameOrGeneric(*(Function **)((long)this + 0x18),curr[1]._id);
    this_03 = *this;
    scope = Local;
    goto LAB_005c25ec;
  case LocalSetId:
    pEVar41 = (Expression *)curr[1].type.id;
    EVar54 = (Expression)
             Function::getLocalNameOrGeneric(*(Function **)((long)this + 0x18),curr[1]._id);
    IVar53.str._M_str = (char *)0x2;
    goto LAB_005c29cd;
  case GlobalGetId:
    this_03 = *this;
    sVar51 = *(string_view *)(curr + 1);
    scope = Top;
LAB_005c25ec:
    sVar51 = (string_view)fromName(this_03,(Name)sVar51,scope);
    puVar40 = &DAT_00000018;
    RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar24.inst)->type = Null;
    cashew::Value::free(RVar24.inst,puVar40);
    (RVar24.inst)->type = String;
    ((RVar24.inst)->field_1).str.str = sVar51;
    this = local_38;
    break;
  case GlobalSetId:
    pEVar41 = *(Expression **)(curr + 2);
    EVar54 = curr[1];
    IVar53.str._M_str = &DAT_00000001;
LAB_005c29cd:
    this = local_38;
    name_05.super_IString.str._M_len = EVar54.type.id;
    name_05.super_IString.str._M_str = IVar53.str._M_str;
    RVar24 = makeSetVar(wasm::Expression*,wasm::Expression*,wasm::Name,wasm::NameScope_
                       (local_38,pEVar41,EVar54._0_8_,name_05,(NameScope)in_R9.inst);
    break;
  case LoadId:
    if ((*(char **)(curr + 2) != (char *)0x0) &&
       (IVar53.str._M_str = (char *)(ulong)(byte)(char)curr[1]._id,
       *(char **)(curr + 2) != IVar53.str._M_str)) {
      __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                    ,0x5a8,
                    "Ref wasm::Wasm2JSBuilder::processFunctionBody(Module *, Function *, bool)::ExpressionProcessor::visitLoad(Load *)"
                   );
    }
    RVar24 = makePointer(wasm::Expression*,wasm::Address_
                       (this,*(Expression **)(curr + 3),(Address)curr[1].type.id);
    uVar46 = (curr->type).id;
    if (6 < uVar46) {
LAB_005c3c34:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                    ,0xc6,"BasicType wasm::Type::getBasic() const");
    }
    iVar16 = (int)uVar46;
    if (iVar16 == 5) {
      local_48.inst = (Value *)cashew::HEAPF64;
      pcStack_40 = DAT_00da8da0;
      puVar40 = &DAT_00000018;
      RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
      (RVar25.inst)->type = Null;
      cashew::Value::free(RVar25.inst,puVar40);
      (RVar25.inst)->type = String;
      ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
      ((RVar25.inst)->field_1).str.str._M_str = pcStack_40;
      iVar16 = 3;
    }
    else {
      if (iVar16 == 4) {
        pdVar21 = (double *)&cashew::HEAPF32;
      }
      else {
        if (iVar16 != 2) {
          Fatal::Fatal((Fatal *)&old.str._M_str);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                     "Unhandled type in load: ",0x18);
          Fatal::operator<<((Fatal *)&old.str._M_str,&curr->type);
          goto LAB_005c3e7a;
        }
        bVar2 = *(byte *)&(case_->code).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        IVar53.str._M_str = (char *)(ulong)bVar2;
        if (bVar2 != 4) {
          old.str._M_str._4_4_ = (undefined4)(uVar46 >> 0x20);
          old.str._M_str._0_4_ = iVar16;
          if (bVar2 == 2) {
            if (((uVar46 < 6) &&
                (IVar53.str._M_str = (char *)0x32, (0x32UL >> (uVar46 & 0x3f) & 1) != 0)) ||
               ((uVar19 = wasm::Type::getByteSize((Type *)&old.str._M_str), uVar19 < 3 ||
                (*(char *)((long)&(case_->code).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1) == '\0')))) {
              pdVar21 = (double *)&cashew::HEAPU16;
            }
            else {
              pdVar21 = (double *)&cashew::HEAP16;
            }
            local_48.inst = (Value *)*pdVar21;
            pcStack_40 = (char *)pdVar21[1];
            puVar40 = &DAT_00000018;
            RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
            (RVar25.inst)->type = Null;
            cashew::Value::free(RVar25.inst,puVar40);
            (RVar25.inst)->type = String;
            ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
            ((RVar25.inst)->field_1).str.str._M_str = pcStack_40;
            iVar16 = 1;
          }
          else {
            if (bVar2 != 1) {
              Fatal::Fatal((Fatal *)&old.str._M_str);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                         "Unhandled number of bytes in i32 load: ",0x27);
              Fatal::operator<<((Fatal *)&old.str._M_str,(uchar *)&case_->code);
              goto LAB_005c3e7a;
            }
            if ((((uVar46 < 6) &&
                 (IVar53.str._M_str = (char *)0x32, (0x32UL >> (uVar46 & 0x3f) & 1) != 0)) ||
                (uVar19 = wasm::Type::getByteSize((Type *)&old.str._M_str), uVar19 < 2)) ||
               (*(char *)((long)&(case_->code).
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1) == '\0')) {
              pdVar21 = (double *)&cashew::HEAPU8;
            }
            else {
              pdVar21 = (double *)&cashew::HEAP8;
            }
            local_48.inst = (Value *)*pdVar21;
            pcStack_40 = (char *)pdVar21[1];
            puVar40 = &DAT_00000018;
            RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
            (RVar25.inst)->type = Null;
            cashew::Value::free(RVar25.inst,puVar40);
            (RVar25.inst)->type = String;
            ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
            ((RVar25.inst)->field_1).str.str._M_str = pcStack_40;
            iVar16 = 0;
          }
          goto LAB_005c31ef;
        }
        pdVar21 = (double *)&cashew::HEAP32;
      }
      local_48.inst = (Value *)*pdVar21;
      pcStack_40 = (char *)pdVar21[1];
      puVar40 = &DAT_00000018;
      RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
      (RVar25.inst)->type = Null;
      cashew::Value::free(RVar25.inst,puVar40);
      (RVar25.inst)->type = String;
      ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
      ((RVar25.inst)->field_1).str.str._M_str = pcStack_40;
      iVar16 = 2;
    }
LAB_005c31ef:
    RVar24 = cashew::ValueBuilder::makePtrShift(RVar24,iVar16);
    RVar24 = cashew::ValueBuilder::makeSub(RVar25,RVar24);
    old.str._M_str._0_4_ = (Id)RVar24.inst;
    old.str._M_str._4_4_ = (undefined4)((ulong)RVar24.inst >> 0x20);
    if ((char)case_[1].target.super_IString.str._M_len == '\x01') {
      local_48.inst = (Value *)cashew::ATOMICS;
      pcStack_40 = DAT_00da8ee0;
      puVar40 = &DAT_00000018;
      pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
      pVVar20->type = Null;
      cashew::Value::free(pVVar20,puVar40);
      pVVar20->type = String;
      (pVVar20->field_1).str.str._M_len = (size_t)local_48.inst;
      (pVVar20->field_1).str.str._M_str = pcStack_40;
      key_02.str._M_str = IVar53.str._M_str;
      key_02.str._M_len = DAT_00da8f00;
      RVar24 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar20,cashew::LOAD,key_02);
      RVar24 = cashew::ValueBuilder::makeCall(RVar24);
      ppcVar1 = &old.str._M_str;
      pRVar30 = cashew::Ref::operator[]((Ref *)ppcVar1,1);
      cashew::ValueBuilder::appendToCall(RVar24,pRVar30->inst);
      pRVar30 = cashew::Ref::operator[]((Ref *)ppcVar1,2);
      cashew::ValueBuilder::appendToCall(RVar24,pRVar30->inst);
      old.str._M_str._0_4_ = (Id)RVar24.inst;
      old.str._M_str._4_4_ = (undefined4)((ulong)RVar24.inst >> 0x20);
    }
    this = local_38;
    if ((*(int *)(*local_38 + 100) != 0) && ((*(byte *)(local_38 + 5) & 1) == 0)) break;
    type.id = (curr->type).id;
LAB_005c32ce:
    JVar18 = wasmToJsType(type);
    goto LAB_005c32d8;
  case StoreId:
    RVar24 = visitStore(wasm::Store__(this,(Store *)curr);
    this = this;
    break;
  case ConstId:
    RVar24 = visitConst(wasm::Const__(curr,(Const *)&switchD_005c1c9d::switchdataD_00b3b118);
    this = this;
    break;
  case UnaryId:
    uVar46 = (curr->type).id;
    local_a8 = (undefined1  [8])curr;
    if (6 < uVar46) goto LAB_005c3c34;
    iVar16 = (int)uVar46;
    if (1 < iVar16 - 4U) {
      if (iVar16 != 2) {
        Fatal::Fatal((Fatal *)&old.str._M_str);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                   "Unhandled type in unary: ",0x19);
        Fatal::operator<<((Fatal *)&old.str._M_str,(Unary **)local_a8);
        goto LAB_005c3e7a;
      }
      IVar4 = curr[1]._id;
      if ((int)IVar4 < 0x14) {
        if (IVar4 != InvalidId) {
          if ((IVar4 == IfId) || (IVar4 == BreakId)) {
            handle_unreachable("i32 unary should have been removed",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                               ,0x671);
          }
          goto switchD_005c2ffa_caseD_31;
        }
        nextResult_22.str._M_str = (char *)DAT_00da8850;
        nextResult_22.str._M_len = EXPRESSION_RESULT;
        RVar24.inst = DAT_00da8850;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_22);
        goto LAB_005c2e2d;
      }
      RVar24.inst = DAT_00da8850;
      if (IVar4 - MemorySizeId < 0xe) {
        specific_05.str._M_str =
             (char *)((long)&switchD_005c3311::switchdataD_00b3b48c +
                     (long)(int)(&switchD_005c3311::switchdataD_00b3b48c)[IVar4 - MemorySizeId]);
        switch(IVar4) {
        case MemorySizeId:
          nextResult_36.str._M_str = (char *)DAT_00da8850;
          nextResult_36.str._M_len = EXPRESSION_RESULT;
          RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_36);
          break;
        default:
          goto switchD_005c2ffa_caseD_31;
        case AtomicCmpxchgId:
        case SIMDExtractId:
          goto switchD_005c2ffa_caseD_34;
        case AtomicNotifyId:
        case SIMDShuffleId:
          goto switchD_005c2ffa_caseD_35;
        case SIMDShiftId:
          specific_05.str._M_len = DAT_00da8890;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_F32,specific_05);
          specific_06.str._M_str = specific_05.str._M_str;
          specific_06.str._M_len = DAT_00da8860;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_I32,specific_06);
          sVar36 = DAT_00da8890;
          pMVar43 = ABI::wasm2js::SCRATCH_STORE_F32;
          nextResult_35.str._M_str = (char *)DAT_00da8850;
          nextResult_35.str._M_len = EXPRESSION_RESULT;
          RVar24.inst = DAT_00da8850;
          RVar25 = IString_(local_38,(Expression *)curr[1].type.id,nextResult_35);
          target_09.str._M_str = (char *)RVar25.inst;
          target_09.str._M_len = sVar36;
          RVar25 = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)pMVar43,target_09,RVar24);
          sVar36 = DAT_00da8860;
          pMVar43 = ABI::wasm2js::SCRATCH_LOAD_I32;
          puVar40 = &DAT_00000018;
          pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
          pVVar20->type = Null;
          cashew::Value::free(pVVar20,puVar40);
          pVVar20->type = Number;
          (pVVar20->field_1).str.str._M_len = 0x4000000000000000;
          target_10.str._M_str = (char *)pVVar20;
          target_10.str._M_len = sVar36;
          RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)pMVar43,target_10,RVar24);
          goto LAB_005c3819;
        }
LAB_005c3857:
        this = local_38;
        op_03.str._M_str = (char *)RVar25.inst;
        op_03.str._M_len = sVar49;
        RVar24 = cashew::ValueBuilder::makeUnary(this_02,op_03,RVar24);
        break;
      }
      switch(IVar4) {
      case TableSizeId:
        nextResult_24.str._M_str = (char *)DAT_00da8850;
        nextResult_24.str._M_len = EXPRESSION_RESULT;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_24);
        sVar36 = DAT_00da8d10;
        RVar24.inst = cashew::LSHIFT.inst;
        puVar40 = &DAT_00000018;
        pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        pVVar20->type = Null;
        cashew::Value::free(pVVar20,puVar40);
        pVVar20->type = Number;
        (pVVar20->field_1).arr = (ArrayStorage *)0x4038000000000000;
        op_04.str._M_str = (char *)pVVar20;
        op_04.str._M_len = sVar36;
        RVar24 = cashew::ValueBuilder::makeBinary(RVar25.inst,RVar24,op_04,in_R8);
        sVar36 = DAT_00da8d00;
        RVar26.inst = cashew::RSHIFT;
        puVar40 = &DAT_00000018;
        RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        (RVar25.inst)->type = Null;
        cashew::Value::free(RVar25.inst,puVar40);
        (RVar25.inst)->type = Number;
        pAVar31 = (ArrayStorage *)0x4038000000000000;
        break;
      case TableGrowId:
        nextResult_37.str._M_str = (char *)DAT_00da8850;
        nextResult_37.str._M_len = EXPRESSION_RESULT;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_37);
        sVar36 = DAT_00da8d10;
        RVar24.inst = cashew::LSHIFT.inst;
        puVar40 = &DAT_00000018;
        pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        pVVar20->type = Null;
        cashew::Value::free(pVVar20,puVar40);
        pVVar20->type = Number;
        (pVVar20->field_1).arr = (ArrayStorage *)0x4030000000000000;
        op_08.str._M_str = (char *)pVVar20;
        op_08.str._M_len = sVar36;
        RVar24 = cashew::ValueBuilder::makeBinary(RVar25.inst,RVar24,op_08,in_R8);
        sVar36 = DAT_00da8d00;
        RVar26.inst = cashew::RSHIFT;
        puVar40 = &DAT_00000018;
        RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        (RVar25.inst)->type = Null;
        cashew::Value::free(RVar25.inst,puVar40);
        (RVar25.inst)->type = Number;
        pAVar31 = (ArrayStorage *)0x4030000000000000;
        break;
      default:
switchD_005c2ffa_caseD_31:
        handle_unreachable("unhandled unary",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                           ,0x6b1);
      case TupleMakeId:
      case I31NewId:
switchD_005c2ffa_caseD_34:
        nextResult_25.str._M_str = (char *)DAT_00da8850;
        nextResult_25.str._M_len = EXPRESSION_RESULT;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_25);
        op_00.str._M_str = (char *)RVar25.inst;
        op_00.str._M_len = sVar15;
        RVar25 = cashew::ValueBuilder::makeUnary(this_00,op_00,RVar24);
        this_02 = this_00;
        sVar49 = sVar15;
        goto LAB_005c3857;
      case TupleExtractId:
      case I31GetId:
switchD_005c2ffa_caseD_35:
        nextResult_27.str._M_str = (char *)DAT_00da8850;
        nextResult_27.str._M_len = EXPRESSION_RESULT;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_27);
        op_01.str._M_str = (char *)RVar25.inst;
        op_01.str._M_len = sVar15;
        RVar25 = cashew::ValueBuilder::makeUnary(this_00,op_01,RVar24);
        op_02.str._M_str = (char *)RVar25.inst;
        op_02.str._M_len = sVar15;
        RVar24 = cashew::ValueBuilder::makeUnary(this_00,op_02,RVar24);
        sVar36 = DAT_00da8d20;
        RVar26.inst = cashew::TRSHIFT.inst;
        puVar40 = &DAT_00000018;
        RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        (RVar25.inst)->type = Null;
        cashew::Value::free(RVar25.inst,puVar40);
        (RVar25.inst)->type = Number;
        ((RVar25.inst)->field_1).str.str._M_len = 0;
        this = local_38;
        goto LAB_005c3be4;
      }
      ((RVar25.inst)->field_1).arr = pAVar31;
      this = local_38;
      goto LAB_005c3be4;
    }
    switch(curr[1]._id) {
    case CallId:
    case CallIndirectId:
      nextResult_03.str._M_str = (char *)DAT_00da8850;
      nextResult_03.str._M_len = EXPRESSION_RESULT;
      RVar24.inst = DAT_00da8850;
      RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_03);
      op.str._M_str = (char *)RVar25.inst;
      op.str._M_len = sVar14;
      RVar24 = cashew::ValueBuilder::makeUnary(pVVar8,op,RVar24);
      goto LAB_005c33ab;
    case LocalGetId:
    case LocalSetId:
      puVar38 = &MATH_ABS;
      break;
    case GlobalGetId:
    case GlobalSetId:
      puVar38 = &MATH_CEIL;
      break;
    case LoadId:
    case StoreId:
      puVar38 = &MATH_FLOOR;
      break;
    case ConstId:
    case UnaryId:
      puVar38 = &MATH_TRUNC;
      break;
    case BinaryId:
    case SelectId:
      handle_unreachable("operation should have been removed in previous passes",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x707);
    case DropId:
    case ReturnId:
      puVar38 = &MATH_SQRT;
      break;
    default:
      handle_unreachable("unhandled unary float operator",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x70a);
    case SIMDLoadStoreLaneId:
      nextResult_34.str._M_str = (char *)DAT_00da8850;
      nextResult_34.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_34);
      RVar24 = makeJsCoercion(RVar24,JS_INT);
      goto LAB_005c36ba;
    case MemoryInitId:
      nextResult_32.str._M_str = (char *)DAT_00da8850;
      nextResult_32.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_32);
      RVar24 = makeJsCoercion(RVar24,JS_INT);
      goto LAB_005c3668;
    case DataDropId:
      nextResult_29.str._M_str = (char *)DAT_00da8850;
      nextResult_29.str._M_len = EXPRESSION_RESULT;
      RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_29);
      sVar36 = DAT_00da8d20;
      RVar24.inst = cashew::TRSHIFT.inst;
      puVar40 = &DAT_00000018;
      pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
      pVVar20->type = Null;
      cashew::Value::free(pVVar20,puVar40);
      this = local_38;
      pVVar20->type = Number;
      (pVVar20->field_1).str.str._M_len = 0;
      op_06.str._M_str = (char *)pVVar20;
      op_06.str._M_len = sVar36;
      RVar24 = cashew::ValueBuilder::makeBinary(RVar25.inst,RVar24,op_06,in_R8);
      goto LAB_005c36ba;
    case MemoryCopyId:
      nextResult_31.str._M_str = (char *)DAT_00da8850;
      nextResult_31.str._M_len = EXPRESSION_RESULT;
      RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_31);
      sVar36 = DAT_00da8d20;
      RVar24.inst = cashew::TRSHIFT.inst;
      puVar40 = &DAT_00000018;
      pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
      pVVar20->type = Null;
      cashew::Value::free(pVVar20,puVar40);
      this = local_38;
      pVVar20->type = Number;
      (pVVar20->field_1).str.str._M_len = 0;
      op_07.str._M_str = (char *)pVVar20;
      op_07.str._M_len = sVar36;
      RVar24 = cashew::ValueBuilder::makeBinary(RVar25.inst,RVar24,op_07,in_R8);
      goto LAB_005c3668;
    case RefFuncId:
      nextResult_28.str._M_str = (char *)DAT_00da8850;
      nextResult_28.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_28);
LAB_005c3668:
      JVar18 = JS_DOUBLE;
      goto LAB_005c32d8;
    case RefEqId:
      nextResult_33.str._M_str = (char *)DAT_00da8850;
      nextResult_33.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_33);
LAB_005c36ba:
      JVar18 = JS_FLOAT;
      goto LAB_005c32d8;
    case TableGetId:
      specific_03.str._M_str = (char *)&switchD_005c1dfd::switchdataD_00b3b3ec;
      specific_03.str._M_len = DAT_00da8870;
      puVar33 = &switchD_005c1dfd::switchdataD_00b3b3ec;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_I32,specific_03);
      specific_04.str._M_str = (char *)puVar33;
      specific_04.str._M_len = DAT_00da8880;
      ABI::wasm2js::ensureHelpers((wasm2js *)local_38[4],ABI::wasm2js::SCRATCH_LOAD_F32,specific_04)
      ;
      sVar36 = DAT_00da8870;
      pMVar43 = ABI::wasm2js::SCRATCH_STORE_I32;
      puVar40 = &DAT_00000018;
      pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
      pVVar20->type = Null;
      cashew::Value::free(pVVar20,puVar40);
      pVVar20->type = Number;
      (pVVar20->field_1).str.str._M_len = 0x4000000000000000;
      nextResult_30.str._M_str = (char *)DAT_00da8850;
      nextResult_30.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(local_38,(Expression *)curr[1].type.id,nextResult_30);
      target_07.str._M_str = (char *)pVVar20;
      target_07.str._M_len = sVar36;
      RVar25 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                         ((ValueBuilder *)pMVar43,target_07,RVar24,in_R8);
      target_08.str._M_str = extraout_RDX_03;
      target_08.str._M_len = DAT_00da8880;
      RVar24 = cashew::ValueBuilder::makeCall
                         ((ValueBuilder *)ABI::wasm2js::SCRATCH_LOAD_F32,target_08);
LAB_005c3819:
      this = local_38;
      RVar24 = cashew::ValueBuilder::makeSeq(RVar25,RVar24);
      goto LAB_005c32e0;
    }
    pVVar8 = (ValueBuilder *)*puVar38;
    sVar36 = puVar38[1];
    nextResult_26.str._M_str = (char *)DAT_00da8850;
    nextResult_26.str._M_len = EXPRESSION_RESULT;
    RVar24.inst = DAT_00da8850;
    RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_26);
    target_06.str._M_str = (char *)RVar25.inst;
    target_06.str._M_len = sVar36;
    RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar8,target_06,RVar24);
LAB_005c33ab:
    this = local_38;
    if ((curr->type).id == 4) {
      RVar24 = makeJsCoercion(RVar24,JS_FLOAT);
      this = local_38;
    }
    break;
  case BinaryId:
    nextResult_09.str._M_str = (char *)DAT_00da8850;
    nextResult_09.str._M_len = EXPRESSION_RESULT;
    local_a8 = (undefined1  [8])curr;
    RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_09);
    this = local_38;
    nextResult_10.str._M_str = (char *)DAT_00da8850;
    nextResult_10.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,*(Expression **)(curr + 2),nextResult_10);
    uVar46 = (curr->type).id;
    if (6 < uVar46) goto LAB_005c3c34;
    if ((int)uVar46 - 4U < 2) {
      switch(*(undefined4 *)
              &(case_->code).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start) {
      case 0x32:
      case 0x3f:
        puVar38 = &cashew::PLUS;
        break;
      case 0x33:
      case 0x40:
        puVar38 = &cashew::MINUS;
        break;
      case 0x34:
      case 0x41:
        puVar38 = &cashew::MUL;
        break;
      case 0x35:
      case 0x42:
        puVar38 = &cashew::DIV;
        break;
      default:
        ppcVar1 = &old.str._M_str;
        Fatal::Fatal((Fatal *)ppcVar1);
        Fatal::operator<<((Fatal *)ppcVar1,(char (*) [34])"Unhandled binary float operator: ");
        goto LAB_005c3e7a;
      case 0x37:
      case 0x44:
        puVar38 = &MATH_MIN;
        goto LAB_005c3107;
      case 0x38:
      case 0x45:
        puVar38 = &MATH_MAX;
LAB_005c3107:
        target_05.str._M_str = (char *)RVar24.inst;
        target_05.str._M_len = puVar38[1];
        RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                           ((ValueBuilder *)*puVar38,target_05,RVar25,in_R8);
        goto LAB_005c3119;
      }
      op_05.str._M_str = (char *)RVar25.inst;
      op_05.str._M_len = puVar38[1];
      RVar24 = cashew::ValueBuilder::makeBinary(RVar24.inst,(Value *)*puVar38,op_05,in_R8);
LAB_005c3119:
      if ((case_->target).super_IString.str._M_str != (char *)0x4) break;
      goto LAB_005c36ba;
    }
    if ((int)uVar46 != 2) {
      Fatal::Fatal((Fatal *)&old.str._M_str);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                 "Unhandled type in binary: ",0x1a);
      Fatal::operator<<((Fatal *)&old.str._M_str,(Binary **)local_a8);
LAB_005c3e7a:
      Fatal::~Fatal((Fatal *)&old.str._M_str);
    }
    switch(*(undefined4 *)
            &(case_->code).
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start) {
    case 0:
      puVar38 = &cashew::PLUS;
      break;
    case 1:
      puVar38 = &cashew::MINUS;
      break;
    case 2:
      if (uVar46 == 2) {
        target_11.str._M_str = (char *)RVar24.inst;
        target_11.str._M_len = DAT_00da8640;
        RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                           (MATH_IMUL,target_11,RVar25,in_R8);
        this = (long *)this;
        goto LAB_005c32e0;
      }
      puVar38 = &cashew::MUL;
      goto LAB_005c3bd7;
    case 3:
      RVar24 = makeSigning(RVar24,JS_SIGNED);
      puVar38 = &cashew::DIV;
      goto LAB_005c3afb;
    case 4:
      RVar24 = makeSigning(RVar24,JS_UNSIGNED);
      puVar38 = &cashew::DIV;
      goto LAB_005c3a99;
    case 5:
      RVar24 = makeSigning(RVar24,JS_SIGNED);
      puVar38 = &cashew::MOD;
LAB_005c3afb:
      RVar26.inst = (Value *)*puVar38;
      sVar36 = puVar38[1];
      JVar39 = JS_SIGNED;
LAB_005c3b0a:
      RVar25 = makeSigning(RVar25,JVar39);
      this = local_38;
      goto LAB_005c3b35;
    case 6:
      RVar24 = makeSigning(RVar24,JS_UNSIGNED);
      puVar38 = &cashew::MOD;
LAB_005c3a99:
      RVar26.inst = (Value *)*puVar38;
      sVar36 = puVar38[1];
      JVar39 = JS_UNSIGNED;
      goto LAB_005c3b0a;
    case 7:
      puVar38 = &cashew::AND;
      break;
    case 8:
      puVar38 = &cashew::OR;
      break;
    case 9:
      puVar38 = &cashew::XOR;
      break;
    case 10:
      puVar38 = &cashew::LSHIFT.inst;
      break;
    case 0xb:
      puVar38 = &cashew::RSHIFT;
      break;
    case 0xc:
      puVar38 = &cashew::TRSHIFT.inst;
      break;
    case 0xd:
    case 0xe:
      handle_unreachable("should be removed already",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x791);
    case 0xf:
      RVar24 = makeSigning(RVar24,JS_SIGNED);
      puVar38 = &cashew::EQ;
      goto LAB_005c3baa;
    case 0x10:
      RVar24 = makeSigning(RVar24,JS_SIGNED);
      puVar38 = &cashew::NE;
      goto LAB_005c3baa;
    case 0x11:
      RVar24 = makeSigning(RVar24,JS_SIGNED);
      puVar38 = &cashew::LT;
      goto LAB_005c3baa;
    case 0x12:
      RVar24 = makeSigning(RVar24,JS_UNSIGNED);
      puVar38 = &cashew::LT;
      goto LAB_005c3b82;
    case 0x13:
      RVar24 = makeSigning(RVar24,JS_SIGNED);
      puVar38 = &cashew::LE;
      goto LAB_005c3baa;
    case 0x14:
      RVar24 = makeSigning(RVar24,JS_UNSIGNED);
      puVar38 = &cashew::LE;
      goto LAB_005c3b82;
    case 0x15:
      RVar24 = makeSigning(RVar24,JS_SIGNED);
      puVar38 = &cashew::GT;
      goto LAB_005c3baa;
    case 0x16:
      RVar24 = makeSigning(RVar24,JS_UNSIGNED);
      puVar38 = &cashew::GT;
      goto LAB_005c3b82;
    case 0x17:
      RVar24 = makeSigning(RVar24,JS_SIGNED);
      puVar38 = &cashew::GE;
LAB_005c3baa:
      RVar26.inst = (Value *)*puVar38;
      sVar36 = puVar38[1];
      JVar39 = JS_SIGNED;
LAB_005c3bb9:
      RVar25 = makeSigning(RVar25,JVar39);
      this = local_38;
      goto LAB_005c3be4;
    case 0x18:
      RVar24 = makeSigning(RVar24,JS_UNSIGNED);
      puVar38 = &cashew::GE;
LAB_005c3b82:
      RVar26.inst = (Value *)*puVar38;
      sVar36 = puVar38[1];
      JVar39 = JS_UNSIGNED;
      goto LAB_005c3bb9;
    default:
      handle_unreachable("unhandled i32 binary operator",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x793);
    case 0x39:
    case 0x46:
      puVar38 = &cashew::EQ;
      goto LAB_005c3bd7;
    case 0x3a:
    case 0x47:
      puVar38 = &cashew::NE;
      goto LAB_005c3bd7;
    case 0x3b:
    case 0x48:
      puVar38 = &cashew::LT;
      goto LAB_005c3bd7;
    case 0x3c:
    case 0x49:
      puVar38 = &cashew::LE;
      goto LAB_005c3bd7;
    case 0x3d:
    case 0x4a:
      puVar38 = &cashew::GT;
      goto LAB_005c3bd7;
    case 0x3e:
    case 0x4b:
      puVar38 = &cashew::GE;
LAB_005c3bd7:
      RVar26.inst = (Value *)*puVar38;
      sVar36 = puVar38[1];
LAB_005c3be4:
      op_10.str._M_str = (char *)RVar25.inst;
      op_10.str._M_len = sVar36;
      RVar24 = cashew::ValueBuilder::makeBinary(RVar24.inst,RVar26,op_10,in_R8);
      goto LAB_005c32e0;
    }
    RVar26.inst = (Value *)*puVar38;
    sVar36 = puVar38[1];
LAB_005c3b35:
    op_09.str._M_str = (char *)RVar25.inst;
    op_09.str._M_len = sVar36;
    RVar24 = cashew::ValueBuilder::makeBinary(RVar24.inst,RVar26,op_09,in_R8);
    JVar18 = wasmToJsType((Type)(case_->target).super_IString.str._M_str);
LAB_005c32d8:
    RVar24 = makeJsCoercion(RVar24,JVar18);
    this = (long *)this;
    break;
  case SelectId:
    RVar24 = visitSelect(wasm::Select__(this,(Select *)curr);
    this = this;
    break;
  case DropId:
    pEVar41 = *(Expression **)(curr + 1);
    IVar53.str._M_str = DAT_00da8840;
    specific_05.str._M_str = NO_RESULT;
LAB_005c2777:
    nextResult_15.str._M_str = IVar53.str._M_str;
    nextResult_15.str._M_len = (size_t)specific_05.str._M_str;
    RVar24 = IString_(this,pEVar41,nextResult_15);
    this = this;
    break;
  case ReturnId:
    if (*(Expression **)(curr + 1) == (Expression *)0x0) {
      RVar24.inst = (Value *)0x0;
    }
    else {
      nextResult_20.str._M_str = (char *)DAT_00da8850;
      nextResult_20.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,*(Expression **)(curr + 1),nextResult_20);
      if (((*(int *)(*this + 100) == 0) || (*(char *)((long)this + 0x28) != '\0')) ||
         (sVar27 = std::
                   _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)(*this + 0x330),*(key_type **)((long)this + 0x18)), sVar27 != 0)) {
        JVar18 = wasmToJsType((Type)*(uintptr_t *)(*(long *)(curr + 1) + 8));
        RVar24 = makeJsCoercion(RVar24,JVar18);
      }
    }
    RVar24 = cashew::ValueBuilder::makeReturn(RVar24);
    this = this;
    break;
  case MemorySizeId:
    sVar36 = DAT_00da8780;
    pMVar43 = WASM_MEMORY_SIZE;
    goto LAB_005c2a09;
  case MemoryGrowId:
    pwVar42 = *(wasm2js **)((long)this + 0x20);
    if ((*(long **)(pwVar42 + 0x78) == *(long **)(pwVar42 + 0x80)) ||
       (lVar37 = **(long **)(pwVar42 + 0x78), IVar53.str._M_str = *(char **)(lVar37 + 0x40),
       IVar53.str._M_str <= *(char **)(lVar37 + 0x38))) {
      specific_02.str._M_str = IVar53.str._M_str;
      specific_02.str._M_len = DAT_00da8930;
      ABI::wasm2js::ensureHelpers(pwVar42,ABI::wasm2js::TRAP,specific_02);
      target_03.str._M_str = extraout_RDX_00;
      target_03.str._M_len = DAT_00da8930;
      RVar24 = cashew::ValueBuilder::makeCall((ValueBuilder *)ABI::wasm2js::TRAP,target_03);
      this = local_38;
      break;
    }
    nextResult_16.str._M_str = (char *)DAT_00da8850;
    nextResult_16.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(this,*(Expression **)(curr + 1),nextResult_16);
    JVar18 = wasmToJsType((Type)*(uintptr_t *)(*(long *)(curr + 1) + 8));
    RVar25 = makeJsCoercion(RVar24,JVar18);
    RVar24.inst = (Value *)curr;
    sVar36 = sVar13;
    pMVar43 = pMVar12;
    goto LAB_005c2e2d;
  case NopId:
  case AtomicFenceId:
    RVar24 = cashew::ValueBuilder::makeToplevel();
    this = this;
    break;
  case UnreachableId:
    specific_01.str._M_str = IVar53.str._M_str;
    specific_01.str._M_len = DAT_00da8930;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TRAP,specific_01);
    specific_05.str._M_str = extraout_RDX;
    sVar36 = DAT_00da8930;
    pMVar43 = ABI::wasm2js::TRAP;
LAB_005c2a09:
    this = local_38;
    target_02.str._M_str = specific_05.str._M_str;
    target_02.str._M_len = sVar36;
    RVar24 = cashew::ValueBuilder::makeCall((ValueBuilder *)pMVar43,target_02);
    break;
  case AtomicRMWId:
    HVar52 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)(byte)curr[1].field_0x4,*(Expression **)(curr + 2),
                        (Index)curr[1].type.id);
    puVar33 = &switchD_005c2439::switchdataD_00b3b4e8;
    switch(curr[1]._id) {
    case InvalidId:
      IVar53.str._M_str = "add";
      break;
    case BlockId:
      IVar53.str._M_str = "sub";
      break;
    case IfId:
      IVar53.str._M_str = "and";
      break;
    case LoopId:
      IVar53.str._M_str = "or";
      this_04 = (IString *)0x2;
      goto LAB_005c2f10;
    case BreakId:
      IVar53.str._M_str = "xor";
      break;
    case SwitchId:
      IVar53.str._M_str = "exchange";
      this_04 = (IString *)&DAT_00000008;
      goto LAB_005c2f10;
    default:
      handle_unreachable("unimp",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                         ,0x844);
    }
    this_04 = (IString *)0x3;
LAB_005c2f10:
    sVar51._M_str = (char *)0x0;
    sVar51._M_len = (size_t)IVar53.str._M_str;
    sVar51 = IString::interned(this_04,sVar51,true);
    key_01.str._M_len = sVar51._M_str;
    local_48.inst = (Value *)cashew::ATOMICS;
    pcStack_40 = DAT_00da8ee0;
    puVar40 = &DAT_00000018;
    pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    pVVar20->type = Null;
    cashew::Value::free(pVVar20,puVar40);
    pVVar20->type = String;
    (pVVar20->field_1).str.str._M_len = (size_t)local_48.inst;
    (pVVar20->field_1).str.str._M_str = pcStack_40;
    key_01.str._M_str = (char *)puVar33;
    RVar24 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar20,(Value *)sVar51._M_len,key_01);
    RVar24 = cashew::ValueBuilder::makeCall(RVar24);
    cashew::ValueBuilder::appendToCall(RVar24,HVar52.heap.inst);
    cashew::ValueBuilder::appendToCall(RVar24,HVar52.ptr.inst);
    this = local_38;
    nextResult_23.str._M_str = (char *)DAT_00da8850;
    nextResult_23.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)case_[1].target.super_IString.str._M_len,nextResult_23)
    ;
LAB_005c2fb3:
    cashew::ValueBuilder::appendToCall(RVar24,RVar25);
    break;
  case AtomicCmpxchgId:
    HVar52 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)(byte)(char)curr[1]._id,*(Expression **)(curr + 2),
                        (Index)curr[1].type.id);
    local_48 = HVar52.ptr.inst;
    nextResult_07.str._M_str = (char *)DAT_00da8850;
    nextResult_07.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[2].type.id,nextResult_07);
    nextResult_08.str._M_str = (char *)DAT_00da8850;
    nextResult_08.str._M_len = EXPRESSION_RESULT;
    pVVar20 = DAT_00da8850;
    RVar26 = IString_(local_38,*(Expression **)(curr + 3),nextResult_08);
    case_ = cashew::ATOMICS;
    pcStack_50 = DAT_00da8ee0;
    puVar40 = &DAT_00000018;
    this_01 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    this_01->type = Null;
    cashew::Value::free(this_01,puVar40);
    this_01->type = String;
    (this_01->field_1).arr = (ArrayStorage *)case_;
    (this_01->field_1).str.str._M_str = pcStack_50;
    key_00.str._M_str = (char *)pVVar20;
    key_00.str._M_len = DAT_00da8ef0;
    RVar24 = cashew::ValueBuilder::makeDot((ValueBuilder *)this_01,cashew::COMPARE_EXCHANGE,key_00);
    RVar24 = cashew::ValueBuilder::makeCall(RVar24);
    cashew::ValueBuilder::appendToCall(RVar24,HVar52.heap.inst);
    cashew::ValueBuilder::appendToCall(RVar24,local_48);
    cashew::ValueBuilder::appendToCall(RVar24,RVar25);
    cashew::ValueBuilder::appendToCall(RVar24,RVar26);
    JVar18 = wasmToJsType((Type)(curr->type).id);
    this = local_38;
    goto LAB_005c32d8;
  case AtomicWaitId:
  case SIMDExtractId:
  case SIMDReplaceId:
  case SIMDShuffleId:
  case SIMDTernaryId:
  case SIMDShiftId:
  case SIMDLoadId:
  case SIMDLoadStoreLaneId:
  case PopId:
  case RefNullId:
  case RefIsNullId:
  case RefFuncId:
  case RefEqId:
  case TableGetId:
  case TableSetId:
  case TableSizeId:
  case TableGrowId:
  case TryId:
  case ThrowId:
  case RethrowId:
  case TupleMakeId:
  case TupleExtractId:
  case I31NewId:
  case I31GetId:
  case CallRefId:
  case RefTestId:
  case RefCastId:
  case BrOnId:
  case StructNewId:
  case StructGetId:
  case StructSetId:
  case ArrayNewId:
  case ArrayNewSegId:
  case ArrayNewFixedId:
  case ArrayGetId:
  case ArraySetId:
  case ArrayLenId:
  case ArrayCopyId:
  case ArrayFillId:
  case ArrayInitId:
  case RefAsId:
  case StringNewId:
  case StringConstId:
  case StringMeasureId:
  case StringEncodeId:
  case StringConcatId:
  case StringEqId:
  case StringAsId:
  case StringWTF8AdvanceId:
  case StringWTF16GetId:
  case StringIterNextId:
  case StringIterMoveId:
  case StringSliceWTFId:
  case StringSliceIterId:
    unimplemented(wasm::Expression__(curr,(Expression *)&switchD_005c1c9d::switchdataD_00b3b118);
LAB_005c3bf6:
    __assert_fail("index < usedElements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                  ,0xbc,
                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                 );
  case AtomicNotifyId:
    local_48.inst = (Value *)cashew::ATOMICS;
    pcStack_40 = DAT_00da8ee0;
    puVar40 = &DAT_00000018;
    pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    pVVar20->type = Null;
    cashew::Value::free(pVVar20,puVar40);
    pVVar20->type = String;
    (pVVar20->field_1).str.str._M_len = (size_t)local_48.inst;
    (pVVar20->field_1).str.str._M_str = pcStack_40;
    sVar51 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xb82d41),
                               SUB81(IVar53.str._M_str,0));
    key.str._M_len = sVar51._M_str;
    key.str._M_str = IVar53.str._M_str;
    RVar24 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar20,(Value *)sVar51._M_len,key);
    RVar24 = cashew::ValueBuilder::makeCall(RVar24);
    local_48.inst = (Value *)cashew::HEAP32;
    pcStack_40 = DAT_00da8d50;
    puVar40 = &DAT_00000018;
    RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar25.inst)->type = Null;
    cashew::Value::free(RVar25.inst,puVar40);
    this = local_38;
    (RVar25.inst)->type = String;
    ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
    ((RVar25.inst)->field_1).str.str._M_str = pcStack_40;
    cashew::ValueBuilder::appendToCall(RVar24,RVar25);
    RVar25 = makePointer(wasm::Expression*,wasm::Address_
                       (this,(Expression *)curr[1].type.id,(Address)*(address64_t *)(curr + 1));
    RVar25 = cashew::ValueBuilder::makePtrShift(RVar25,2);
    cashew::ValueBuilder::appendToCall(RVar24,RVar25);
    nextResult_04.str._M_str = (char *)DAT_00da8850;
    nextResult_04.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(this,*(Expression **)(curr + 2),nextResult_04);
    RVar25 = makeSigning(RVar25,JS_UNSIGNED);
    goto LAB_005c2fb3;
  case MemoryInitId:
    IVar53.str._M_len = (size_t)DAT_00da88c0;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::MEMORY_INIT,IVar53);
    local_48.inst = (Value *)ABI::wasm2js::MEMORY_INIT;
    case_ = DAT_00da88c0;
    IVar17 = getDataIndex((Wasm2JSBuilder *)*local_38,(Name)curr[1]);
    local_60 = (pointer)(double)IVar17;
    puVar40 = &DAT_00000018;
    pVVar20 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    pVVar20->type = Null;
    cashew::Value::free(pVVar20,puVar40);
    pVVar20->type = Number;
    (pVVar20->field_1).num = (double)local_60;
    nextResult_00.str._M_str = (char *)DAT_00da8850;
    nextResult_00.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(local_38,*(Expression **)(curr + 2),nextResult_00);
    nextResult_01.str._M_str = (char *)DAT_00da8850;
    nextResult_01.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[2].type.id,nextResult_01);
    nextResult_02.str._M_str = (char *)DAT_00da8850;
    nextResult_02.str._M_len = EXPRESSION_RESULT;
    RVar26 = IString_(local_38,*(Expression **)(curr + 3),nextResult_02);
    this = local_38;
    target.str._M_str = (char *)pVVar20;
    target.str._M_len = (size_t)case_;
    RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref,cashew::Ref>
                       (local_48.inst,target,RVar24,RVar25,RVar26,args_3);
    break;
  case DataDropId:
    specific.str._M_str = IVar53.str._M_str;
    specific.str._M_len = DAT_00da88f0;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::DATA_DROP,specific);
    sVar36 = DAT_00da88f0;
    pMVar43 = ABI::wasm2js::DATA_DROP;
    IVar17 = getDataIndex((Wasm2JSBuilder *)*local_38,(Name)curr[1]);
    local_48.inst = (Value *)(double)IVar17;
    puVar40 = &DAT_00000018;
    RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar25.inst)->type = Null;
    cashew::Value::free(RVar25.inst,puVar40);
    (RVar25.inst)->type = Number;
    ((RVar25.inst)->field_1).num = (double)local_48.inst;
    RVar24.inst = (Value *)curr;
    this = local_38;
LAB_005c2e2d:
    target_04.str._M_str = (char *)RVar25.inst;
    target_04.str._M_len = sVar36;
    RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref>((ValueBuilder *)pMVar43,target_04,RVar24);
    break;
  case MemoryCopyId:
    pwVar42 = *(wasm2js **)((long)this + 0x20);
    puVar38 = &ABI::wasm2js::MEMORY_COPY;
    goto LAB_005c2878;
  case MemoryFillId:
    pwVar42 = *(wasm2js **)((long)this + 0x20);
    puVar38 = &ABI::wasm2js::MEMORY_FILL;
LAB_005c2878:
    specific_00.str._M_str = IVar53.str._M_str;
    specific_00.str._M_len = puVar38[1];
    ABI::wasm2js::ensureHelpers(pwVar42,(Module *)*puVar38,specific_00);
    pVVar8 = (ValueBuilder *)*puVar38;
    local_48.inst = (Value *)puVar38[1];
    nextResult_17.str._M_str = (char *)DAT_00da8850;
    nextResult_17.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(local_38,*(Expression **)(curr + 1),nextResult_17);
    nextResult_18.str._M_str = (char *)DAT_00da8850;
    nextResult_18.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[1].type.id,nextResult_18);
    nextResult_19.str._M_str = (char *)DAT_00da8850;
    nextResult_19.str._M_len = EXPRESSION_RESULT;
    RVar26 = IString_(local_38,*(Expression **)(curr + 2),nextResult_19);
    this = local_38;
    target_01.str._M_str = (char *)RVar24.inst;
    target_01.str._M_len = (size_t)local_48.inst;
    RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref>
                       (pVVar8,target_01,RVar25,RVar26,in_R9);
    break;
  default:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                       ,0x45);
  }
LAB_005c32e0:
  *(Value **)((long)this + 8) = args_3.inst;
  *(size_t *)((long)this + 0x10) = old.str._M_len;
  return (Ref)RVar24.inst;
}

Assistant:

Ref visit(Expression* curr, IString nextResult) {
      IString old = result;
      result = nextResult;
      Ref ret = OverriddenVisitor::visit(curr);
      // keep it consistent for the rest of this frame, which may call visit on
      // multiple children
      result = old;
      return ret;
    }